

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O0

int md_text_with_null_replacement(MD_CTX *ctx,MD_TEXTTYPE type,MD_CHAR *str,MD_SIZE size)

{
  int iVar1;
  uint in_ECX;
  long in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  bool bVar2;
  int ret;
  MD_OFFSET off;
  uint local_28;
  uint local_24;
  long local_20;
  
  local_28 = 0;
  local_20 = in_RDX;
  local_24 = in_ECX;
  while( true ) {
    while( true ) {
      bVar2 = false;
      if (local_28 < local_24) {
        bVar2 = *(char *)(local_20 + (ulong)local_28) != '\0';
      }
      if (!bVar2) break;
      local_28 = local_28 + 1;
    }
    if (local_28 != 0) {
      iVar1 = (**(code **)(in_RDI + 0x38))(in_ESI,local_20,local_28,*(undefined8 *)(in_RDI + 0x50));
      if (iVar1 != 0) {
        return iVar1;
      }
      local_20 = local_20 + (ulong)local_28;
      local_24 = local_24 - local_28;
      local_28 = 0;
    }
    if (local_24 <= local_28) break;
    iVar1 = (**(code **)(in_RDI + 0x38))(1,"",1,*(undefined8 *)(in_RDI + 0x50));
    if (iVar1 != 0) {
      return iVar1;
    }
    local_28 = local_28 + 1;
  }
  return 0;
}

Assistant:

static int
md_text_with_null_replacement(MD_CTX* ctx, MD_TEXTTYPE type, const CHAR* str, SZ size)
{
    OFF off = 0;
    int ret = 0;

    while(1) {
        while(off < size  &&  str[off] != _T('\0'))
            off++;

        if(off > 0) {
            ret = ctx->parser.text(type, str, off, ctx->userdata);
            if(ret != 0)
                return ret;

            str += off;
            size -= off;
            off = 0;
        }

        if(off >= size)
            return 0;

        ret = ctx->parser.text(MD_TEXT_NULLCHAR, _T(""), 1, ctx->userdata);
        if(ret != 0)
            return ret;
        off++;
    }
}